

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::join
          (Vector<wasm::RandomFullLattice> *this,Element *joinee,Element *joiner)

{
  uint __line;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *__assertion;
  bool bVar4;
  size_t i;
  ulong i_00;
  
  lVar3 = (long)(joinee->
                super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(joinee->
                super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = lVar3 >> 4;
  if (uVar2 == this->size) {
    if ((long)(joiner->
              super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(joiner->
              super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
              )._M_impl.super__Vector_impl_data._M_start == lVar3) {
      lVar3 = 0;
      bVar4 = false;
      for (i_00 = 0; i_00 < uVar2; i_00 = i_00 + 1) {
        bVar1 = joinAtIndex(this,joinee,i_00,
                            (Element *)
                            ((long)&(((joiner->
                                      super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                    super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar3));
        bVar4 = (bool)(bVar4 | bVar1);
        uVar2 = this->size;
        lVar3 = lVar3 + 0x10;
      }
      return bVar4;
    }
    __assertion = "joiner.size() == size";
    __line = 0x55;
  }
  else {
    __assertion = "joinee.size() == size";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,__line,
                "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
               );
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }